

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::post_restart(NavierStokesBase *this)

{
  double *pdVar1;
  string *psVar2;
  Vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  Real RVar3;
  Real RVar4;
  istringstream isp;
  string fileCharPtrString;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string File;
  string file;
  string line;
  MultiFab *Savg_old;
  MultiFab *Savg;
  Real dt;
  Real prev_time;
  Real cur_time;
  int finest_level;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  AmrLevel *in_stack_fffffffffffffba0;
  NavierStokesBase *in_stack_fffffffffffffbb0;
  size_type in_stack_fffffffffffffbb8;
  StateData *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  Print *in_stack_fffffffffffffbd0;
  istringstream local_3f8 [8];
  Print *in_stack_fffffffffffffc10;
  StateData *in_stack_fffffffffffffc20;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffc48;
  Real in_stack_fffffffffffffc50;
  Real in_stack_fffffffffffffc58;
  StateDescriptor *in_stack_fffffffffffffc60;
  DistributionMapping *in_stack_fffffffffffffc68;
  BoxArray *in_stack_fffffffffffffc70;
  Box *in_stack_fffffffffffffc78;
  StateData *in_stack_fffffffffffffc80;
  allocator local_271;
  string local_270 [36];
  MPI_Comm local_24c;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  MultiFab *local_1d0;
  MultiFab *local_1c8;
  double local_1c0;
  MPI_Comm *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined1 bExitOnError;
  Vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  
  bExitOnError = (undefined1)((ulong)in_stack_fffffffffffffe50 >> 0x38);
  make_rho_prev_time(in_stack_fffffffffffffbb0);
  make_rho_curr_time(in_stack_fffffffffffffbb0);
  if (0 < avg_interval) {
    amrex::AmrMesh::finestLevel(*(AmrMesh **)(in_RDI + 0x150));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbb8);
    if (average_in_checkpoint == 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffffbd0,(ostream *)in_stack_fffffffffffffbc8);
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffffba0,
                 (char (*) [61])CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      amrex::Print::operator<<
                ((Print *)in_stack_fffffffffffffba0,
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      amrex::Print::~Print(in_stack_fffffffffffffc10);
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffba0,
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      RVar3 = amrex::StateData::curTime(in_stack_fffffffffffffbc0);
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffba0,
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      RVar4 = amrex::StateData::prevTime((StateData *)in_stack_fffffffffffffbb0);
      local_1c0 = RVar3 - RVar4;
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffba0,
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      amrex::Geometry::Domain((Geometry *)(in_RDI + 0x10));
      amrex::DescriptorList::operator[]
                ((DescriptorList *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
      amrex::AmrLevel::Factory(in_stack_fffffffffffffba0);
      amrex::StateData::define
                (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                 in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_1c8 = amrex::AmrLevel::get_new_data(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c)
      ;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffba0,
                 (value_type)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffba0,
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      amrex::StateData::allocOldData(in_stack_fffffffffffffc20);
      local_1d0 = amrex::AmrLevel::get_old_data(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c)
      ;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffba0,
                 (value_type)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                          CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      *pdVar1 = 0.0;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                          CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      *pdVar1 = 0.0;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
                          CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      *pdVar1 = 0.0;
    }
    else {
      std::__cxx11::string::string(local_1f0);
      psVar2 = amrex::Amr::theRestartFile_abi_cxx11_(*(Amr **)(in_RDI + 0x150));
      std::__cxx11::string::string(local_210,(string *)psVar2);
      std::operator+(in_stack_fffffffffffffbc8,(char *)in_stack_fffffffffffffbc0);
      amrex::Vector<char,_std::allocator<char>_>::Vector
                ((Vector<char,_std::allocator<char>_> *)0x7c5544);
      local_24c = amrex::ParallelDescriptor::Communicator();
      amrex::ParallelDescriptor::ReadAndBcastFile
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(bool)bExitOnError,
                 in_stack_fffffffffffffe48);
      this_00 = (Vector<double,_std::allocator<double>_> *)
                amrex::Vector<char,_std::allocator<char>_>::dataPtr
                          ((Vector<char,_std::allocator<char>_> *)0x7c557e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,(char *)this_00,&local_271);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::__cxx11::istringstream::istringstream(local_3f8,local_270,_S_in);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_3f8,local_1f0)
      ;
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         (this_00,CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      std::istream::operator>>(local_3f8,pdVar1);
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         (this_00,CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      std::istream::operator>>(local_3f8,pdVar1);
      pdVar1 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         (this_00,CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      *pdVar1 = 0.0;
      std::__cxx11::istringstream::~istringstream(local_3f8);
      std::__cxx11::string::~string(local_270);
      amrex::Vector<char,_std::allocator<char>_>::~Vector
                ((Vector<char,_std::allocator<char>_> *)0x7c5670);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_1f0);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::post_restart ()
{
    make_rho_prev_time();
    make_rho_curr_time();

  if (avg_interval > 0){

    const int   finest_level = parent->finestLevel();
    NavierStokesBase::time_avg.resize(finest_level+1);
    NavierStokesBase::time_avg_fluct.resize(finest_level+1);
    NavierStokesBase::dt_avg.resize(finest_level+1);

    //
    // We assume that if Average_Type is not present, we have just activated
    // the start of averaging
    //
    if ( average_in_checkpoint==0 )
    {
      Print()<<"WARNING! Average not found in checkpoint file. Creating data"
             <<std::endl;

      Real cur_time = state[State_Type].curTime();
      Real prev_time = state[State_Type].prevTime();
      Real dt = cur_time - prev_time;
      state[Average_Type].define(geom.Domain(), grids, dmap, desc_lst[Average_Type],
                               cur_time, dt, Factory());

      MultiFab& Savg   = get_new_data(Average_Type);
      Savg.setVal(0.);
      state[Average_Type].allocOldData();
      MultiFab& Savg_old   = get_old_data(Average_Type);
      Savg_old.setVal(0.);

      NavierStokesBase::dt_avg[level]   = 0;
      NavierStokesBase::time_avg[level] = 0;
      NavierStokesBase::time_avg_fluct[level] = 0;


    }else{
      //
      // If Average_Type data were found, this means that we need to recover the
      // value of time_average
      //
      std::string line;
      std::string file=parent->theRestartFile();

      std::string File(file + "/TimeAverage");
      Vector<char> fileCharPtr;
      ParallelDescriptor::ReadAndBcastFile(File, fileCharPtr);
      std::string fileCharPtrString(fileCharPtr.dataPtr());
      std::istringstream isp(fileCharPtrString, std::istringstream::in);

      // read in title line
      std::getline(isp, line);

      isp >> NavierStokesBase::time_avg[level];
      isp >> NavierStokesBase::time_avg_fluct[level];
      NavierStokesBase::dt_avg[level]   = 0;

    }
  }

// FIXME - should remove ifdef and use runtime parameter instead...
#ifdef AMREX_USE_TURBULENT_FORCING
  //
  // Initialize data structures used for homogenous isentropic forced turbulence.
  // Only need to do it once.
  if (level == 0)
      TurbulentForcing::init_turbulent_forcing(geom.ProbLoArray(),geom.ProbHiArray());
#endif

#ifdef AMREX_PARTICLES
    post_restart_particle ();
#endif
}